

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assetsys.h
# Opt level: O1

void assetsys_internal_remove_collated(assetsys_t *sys,int index)

{
  assetsys_internal_collated_t *paVar1;
  int iVar2;
  
  iVar2 = sys->collated[index].ref_count;
  if (iVar2 < 1) {
    __assert_fail("coll->ref_count > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/mattiasgustavsson_libs/assetsys.h"
                  ,0x1798,"void assetsys_internal_remove_collated(assetsys_t *, const int)");
  }
  paVar1 = sys->collated + index;
  iVar2 = iVar2 + -1;
  paVar1->ref_count = iVar2;
  if (iVar2 != 0) {
    return;
  }
  strpool_decref(&sys->strpool,paVar1->path);
  strpool_discard(&sys->strpool,paVar1->path);
  return;
}

Assistant:

static void assetsys_internal_remove_collated( assetsys_t* sys, int const index )
    {
    struct assetsys_internal_collated_t* coll = &sys->collated[ index ];
    ASSETSYS_ASSERT( coll->ref_count > 0 );
    --coll->ref_count;
    if( coll->ref_count == 0 )
        {
        strpool_decref( &sys->strpool, coll->path );
        strpool_discard( &sys->strpool, coll->path );
        }
    }